

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wav.cpp
# Opt level: O1

SimpleWaveHeader * __thiscall
ASDCP::Wav::SimpleWaveHeader::WriteToFile(SimpleWaveHeader *this,FileWriter *OutFile)

{
  uint in_EDX;
  ui32_t write_count;
  byte_t tmp_header [46];
  uint local_38;
  int local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  undefined2 local_24;
  undefined2 local_22;
  undefined4 local_20;
  undefined4 local_1c;
  undefined2 local_18;
  undefined2 local_16;
  undefined2 local_14;
  undefined4 local_12;
  int local_e;
  
  local_e = *(int *)(OutFile + 0x14);
  local_34 = local_e + 0x26;
  local_38 = FCC_RIFF;
  local_30 = FCC_WAVE;
  local_2c = FCC_fmt_;
  local_28 = 0x12;
  local_24 = *(undefined2 *)OutFile;
  local_22 = *(undefined2 *)(OutFile + 2);
  local_20 = *(undefined4 *)(OutFile + 4);
  local_1c = *(undefined4 *)(OutFile + 8);
  local_18 = *(undefined2 *)(OutFile + 0xc);
  local_16 = *(undefined2 *)(OutFile + 0xe);
  local_14 = *(undefined2 *)(OutFile + 0x10);
  local_12 = FCC_data;
  Kumu::FileWriter::Write((uchar *)this,in_EDX,&local_38);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::Wav::SimpleWaveHeader::WriteToFile(Kumu::FileWriter& OutFile) const
{
  ui32_t write_count;
  byte_t tmp_header[SimpleWavHeaderLength];
  byte_t* p = tmp_header;

  static ui32_t fmt_len =
    sizeof(format)
    + sizeof(nchannels)
    + sizeof(samplespersec)
    + sizeof(avgbps)
    + sizeof(blockalign)
    + sizeof(bitspersample)
    + sizeof(cbsize);

  ui32_t RIFF_len = data_len + SimpleWavHeaderLength - 8;

  p += Kumu::i2p<fourcc>(FCC_RIFF, p);
  p += Kumu::i2p<ui32_t>(KM_i32_LE(RIFF_len), p);
  p += Kumu::i2p<fourcc>(FCC_WAVE, p);
  p += Kumu::i2p<fourcc>(FCC_fmt_, p);
  p += Kumu::i2p<ui32_t>(KM_i32_LE(fmt_len), p);
  p += Kumu::i2p<ui16_t>(KM_i16_LE(format), p);
  p += Kumu::i2p<ui16_t>(KM_i16_LE(nchannels), p);
  p += Kumu::i2p<ui32_t>(KM_i32_LE(samplespersec), p);
  p += Kumu::i2p<ui32_t>(KM_i32_LE(avgbps), p);
  p += Kumu::i2p<ui16_t>(KM_i16_LE(blockalign), p);
  p += Kumu::i2p<ui16_t>(KM_i16_LE(bitspersample), p);
  p += Kumu::i2p<ui16_t>(KM_i16_LE(cbsize), p);
  p += Kumu::i2p<fourcc>(FCC_data, p);
  p += Kumu::i2p<ui32_t>(KM_i32_LE(data_len), p);

  return OutFile.Write(tmp_header, SimpleWavHeaderLength, &write_count);
}